

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glucose.cpp
# Opt level: O1

void __thiscall Gluco::Solver::analyzeFinal(Solver *this,Lit p,vec<Gluco::Lit> *out_conflict)

{
  uint uVar1;
  Lit *pLVar2;
  VarData *pVVar3;
  uint *puVar4;
  long lVar5;
  undefined8 in_RAX;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  undefined8 local_38;
  
  local_38 = CONCAT44((int)((ulong)in_RAX >> 0x20),p.x);
  if (out_conflict->data != (Lit *)0x0) {
    out_conflict->sz = 0;
  }
  vec<Gluco::Lit>::push(out_conflict,(Lit *)&local_38);
  if ((this->trail_lim).sz != 0) {
    (this->seen).data[local_38._0_4_ >> 1] = '\x01';
    iVar7 = (this->trail).sz;
    lVar9 = (long)iVar7;
    if (*(this->trail_lim).data < iVar7) {
      do {
        pLVar2 = (this->trail).data;
        lVar5 = lVar9 + -1;
        lVar9 = lVar9 + -1;
        iVar7 = pLVar2[lVar5].x >> 1;
        if ((this->seen).data[iVar7] != '\0') {
          pVVar3 = (this->vardata).data;
          uVar1 = pVVar3[iVar7].reason;
          uVar6 = (ulong)uVar1;
          if (uVar6 == 0xffffffff) {
            if (pVVar3[iVar7].level < 1) {
              __assert_fail("level(x) > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/glucose/Glucose.cpp"
                            ,0x2fb,"void Gluco::Solver::analyzeFinal(Lit, vec<Lit> &)");
            }
            local_38 = CONCAT44(pLVar2[lVar9].x,local_38._0_4_) ^ 0x100000000;
            vec<Gluco::Lit>::push(out_conflict,(Lit *)((long)&local_38 + 4));
          }
          else {
            if ((this->ca).super_RegionAllocator<unsigned_int>.sz <= uVar1) {
              __assert_fail("r >= 0 && r < sz",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/glucose/Alloc.h"
                            ,0x42,
                            "T &Gluco::RegionAllocator<unsigned int>::operator[](Ref) [T = unsigned int]"
                           );
            }
            puVar4 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
            uVar8 = *(ulong *)(puVar4 + uVar6) & 0xffffffff00000000;
            if ((int)(uint)(uVar8 != 0x200000000) < (int)(*(ulong *)(puVar4 + uVar6) >> 0x20)) {
              uVar8 = (ulong)(uVar8 != 0x200000000);
              do {
                if (0 < (this->vardata).data[(int)puVar4[uVar6 + uVar8 + 3] >> 1].level) {
                  (this->seen).data[(int)puVar4[uVar6 + uVar8 + 3] >> 1] = '\x01';
                }
                uVar8 = uVar8 + 1;
              } while ((long)uVar8 < (long)(int)puVar4[uVar6 + 1]);
            }
          }
          (this->seen).data[iVar7] = '\0';
        }
      } while (*(this->trail_lim).data < lVar9);
    }
    (this->seen).data[local_38._0_4_ >> 1] = '\0';
  }
  return;
}

Assistant:

void Solver::analyzeFinal(Lit p, vec<Lit>& out_conflict)
{
    out_conflict.clear();
    out_conflict.push(p);

    if (decisionLevel() == 0)
        return;

    seen[var(p)] = 1;

    for (int i = trail.size()-1; i >= trail_lim[0]; i--){
        Var x = var(trail[i]);
        if (seen[x]){
            if (reason(x) == CRef_Undef){
                assert(level(x) > 0);
                out_conflict.push(~trail[i]);
            }else{
                Clause& c = ca[reason(x)];
                //                for (int j = 1; j < c.size(); j++) Minisat (glucose 2.0) loop 
                // Bug in case of assumptions due to special data structures for Binary.
                // Many thanks to Sam Bayless (sbayless@cs.ubc.ca) for discover this bug.
                for (int j = ((c.size()==2) ? 0:1); j < c.size(); j++)
                    if (level(var(c[j])) > 0)
                        seen[var(c[j])] = 1;
            }  

            seen[x] = 0;
        }
    }

    seen[var(p)] = 0;
}